

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trainer.cc
# Opt level: O2

void __thiscall
xLearn::Trainer::train
          (Trainer *this,vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> *train_reader,
          vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> *test_reader)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Metric *pMVar5;
  int n;
  index_t epoch;
  bool bVar6;
  real_t tr_loss;
  float time_cost;
  undefined1 auVar7 [64];
  real_t te_loss;
  real_t te_metric;
  float local_e0;
  index_t local_dc;
  undefined1 local_d8 [16];
  string metric_type;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  MetricInfo te_info;
  string local_50;
  undefined1 extraout_var [56];
  
  if (this->metric_ == (Metric *)0x0) {
    local_98 = SUB6416(ZEXT464(0x800000),0);
    local_e0 = 3.4028235e+38;
    goto LAB_0014249b;
  }
  (*this->metric_->_vptr_Metric[5])(&metric_type);
  iVar1 = std::__cxx11::string::compare((char *)&metric_type);
  local_98 = SUB6416(ZEXT464(0x7f7fffff),0);
  local_e0 = 1.1754944e-38;
  if (iVar1 != 0) {
    iVar1 = std::__cxx11::string::compare((char *)&metric_type);
    if (iVar1 != 0) {
      iVar1 = std::__cxx11::string::compare((char *)&metric_type);
      if (iVar1 != 0) {
        iVar1 = std::__cxx11::string::compare((char *)&metric_type);
        if (iVar1 != 0) {
          iVar1 = std::__cxx11::string::compare((char *)&metric_type);
          if (iVar1 != 0) {
            iVar1 = std::__cxx11::string::compare((char *)&metric_type);
            if (iVar1 != 0) {
              iVar1 = std::__cxx11::string::compare((char *)&metric_type);
              if (iVar1 != 0) {
                iVar1 = std::__cxx11::string::compare((char *)&metric_type);
                local_e0 = 0.0;
                local_98 = ZEXT816(0);
                if (iVar1 != 0) goto LAB_00142473;
              }
            }
            local_98 = SUB6416(ZEXT464(0x800000),0);
            local_e0 = 3.4028235e+38;
          }
        }
      }
    }
  }
LAB_00142473:
  std::__cxx11::string::~string((string *)&metric_type);
LAB_0014249b:
  if (this->quiet_ == false) {
    show_head_info(this,(test_reader->
                        super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>).
                        _M_impl.super__Vector_impl_data._M_start !=
                        (test_reader->
                        super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>).
                        _M_impl.super__Vector_impl_data._M_finish);
  }
  iVar1 = 0;
  epoch = 1;
  local_dc = 0;
  do {
    uVar4 = this->epoch_;
    if ((int)uVar4 < (int)epoch) {
LAB_00142678:
      if ((this->early_stop_ == true) && (local_dc != uVar4)) {
        if (this->metric_ == (Metric *)0x0) {
          std::__cxx11::string::string((string *)&metric_type,"loss",(allocator *)&local_50);
        }
        else {
          (*this->metric_->_vptr_Metric[5])(&metric_type);
        }
        StringPrintf_abi_cxx11_
                  (&local_50,"Early-stopping at epoch %d, best %s: %f",(double)local_e0,
                   (ulong)local_dc,metric_type._M_dataplus._M_p);
        Color::print_action(&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        Model::Shrink(this->model_);
        std::__cxx11::string::~string((string *)&metric_type);
      }
      else {
        std::vector<xLearn::MetricInfo,_std::allocator<xLearn::MetricInfo>_>::push_back
                  (&this->metric_info_,&te_info);
      }
      return;
    }
    Timer::Timer((Timer *)&metric_type);
    Timer::tic((Timer *)&metric_type);
    tr_loss = calc_gradient(this,train_reader);
    if (this->quiet_ == false) {
      if ((test_reader->super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>).
          _M_impl.super__Vector_impl_data._M_start !=
          (test_reader->super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>).
          _M_impl.super__Vector_impl_data._M_finish) {
        auVar7._0_8_ = calc_metric(this,test_reader);
        auVar7._8_56_ = extraout_var;
        local_88 = auVar7._0_16_;
        local_d8 = vmovshdup_avx(local_88);
        te_info = (MetricInfo)vmovlps_avx(local_88);
        local_78 = local_88;
      }
      time_cost = Timer::toc((Timer *)&metric_type);
      te_loss = local_78._0_4_;
      te_metric = local_d8._0_4_;
      show_train_info(this,tr_loss,te_loss,te_metric,time_cost,
                      (test_reader->
                      super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>).
                      _M_impl.super__Vector_impl_data._M_start !=
                      (test_reader->
                      super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>).
                      _M_impl.super__Vector_impl_data._M_finish,epoch);
      if (this->early_stop_ == true) {
        pMVar5 = this->metric_;
        if ((pMVar5 != (Metric *)0x0) || (local_e0 < te_loss)) {
          if (pMVar5 == (Metric *)0x0) {
            pMVar5 = (Metric *)0x0;
          }
          else {
            iVar2 = (*pMVar5->_vptr_Metric[6])(local_d8._0_8_,(ulong)(uint)local_e0);
            pMVar5 = this->metric_;
            if ((char)iVar2 != '\0') {
              local_88._0_4_ =
                   (uint)(pMVar5 == (Metric *)0x0) * local_88._0_4_ +
                   (uint)(pMVar5 != (Metric *)0x0) * (int)te_metric;
              goto LAB_001425d3;
            }
          }
        }
        else {
LAB_001425d3:
          Model::SetBestModel(this->model_);
          pMVar5 = this->metric_;
          local_e0 = (float)local_88._0_4_;
          local_dc = epoch;
        }
        if ((pMVar5 != (Metric *)0x0) || (te_loss <= (float)local_98._0_4_)) {
          iVar2 = 0;
          if (pMVar5 != (Metric *)0x0) {
            iVar3 = (*pMVar5->_vptr_Metric[6])(local_d8._0_8_,local_98._0_8_);
            iVar2 = 0;
            if ((char)iVar3 == '\0') goto LAB_00142630;
          }
        }
        else {
LAB_00142630:
          if (iVar1 == this->stop_window_) {
            uVar4 = this->epoch_;
            goto LAB_00142678;
          }
          iVar2 = iVar1 + 1;
        }
        iVar1 = iVar2;
        bVar6 = this->metric_ == (Metric *)0x0;
        local_98._4_12_ = local_d8._4_12_;
        local_98._0_4_ = (uint)bVar6 * (int)te_loss + (uint)!bVar6 * (int)te_metric;
        local_88 = local_78;
      }
    }
    epoch = epoch + 1;
  } while( true );
}

Assistant:

void Trainer::train(std::vector<Reader*>& train_reader,
                    std::vector<Reader*>& test_reader) {
  int best_epoch = 0;
  int stop_window = 0;
  real_t best_result = 0;
  real_t prev_result = 0;
  if (metric_ == nullptr) {
    best_result = kFloatMax;
    prev_result = kFloatMin;
  } else {
    std::string metric_type = metric_->metric_type();
    // Classification
    if (metric_type.compare("Accuracy") == 0 ||
        metric_type.compare("Precision") == 0 ||
        metric_type.compare("Recall") == 0 ||
        metric_type.compare("F1") == 0 ||
        metric_type.compare("AUC") == 0) {
      best_result = kFloatMin;
      prev_result = kFloatMax;
    } else if (metric_type.compare("MAE") == 0 ||
               metric_type.compare("MAPE") == 0 ||
               metric_type.compare("RMSD") == 0) {  // regression
      best_result = kFloatMax;
      prev_result = kFloatMin;
    }
  }
  MetricInfo te_info;
  // Show header info
  if (!quiet_) { 
    show_head_info(!test_reader.empty()); 
  }
  for (int n = 1; n <= epoch_; ++n) {
    Timer timer;
    timer.tic();
    // Calc grad and update model
    real_t tr_loss = calc_gradient(train_reader);
    // we don't do any evaluation in a quiet model
    if (!quiet_) {
      if (!test_reader.empty()) { 
        te_info = calc_metric(test_reader); 
      }
      // show evaluation metric info
      show_train_info(tr_loss, 
                      te_info.loss_val,
                      te_info.metric_val,
                      timer.toc(), 
                      !test_reader.empty(), 
                      n);
      // Early-stopping
      if (early_stop_) {
        if ((metric_ == nullptr && te_info.loss_val <= best_result) ||
            (metric_ != nullptr && metric_->cmp(te_info.metric_val, 
                                                best_result))) {
          best_result = metric_ == nullptr ? 
            te_info.loss_val : te_info.metric_val;
          best_epoch = n;
          model_->SetBestModel();
        }
        if ((metric_ == nullptr && te_info.loss_val > prev_result) ||
            (metric_ != nullptr && !metric_->cmp(te_info.metric_val, 
                                                 prev_result))) {
          // If the validation loss goes up continuously
          // in stop_window epoch, we stop training
          if (stop_window == stop_window_) { break; }
          stop_window++;
        } else {
          stop_window = 0;
        }
        prev_result = metric_ == nullptr ? 
          te_info.loss_val : te_info.metric_val;
      }
    }
  }
  if (early_stop_ && best_epoch != epoch_) {  // not for cv
    std::string metric_name = metric_ == nullptr ? 
      "loss" : metric_->metric_type();
    Color::print_action(
      StringPrintf("Early-stopping at epoch %d, best %s: %f", 
        best_epoch, metric_name.c_str(), best_result)
    );
    model_->Shrink();
  } else {  // for cv
    metric_info_.push_back(te_info);
  }
}